

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
TestParser_TestInitStmt_Test::~TestParser_TestInitStmt_Test(TestParser_TestInitStmt_Test *this)

{
  TestParser_TestInitStmt_Test *this_local;
  
  ~TestParser_TestInitStmt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestInitStmt){
    cout << R"(
            ---- test_initstmt ----
            )" << endl;
    string buff = R"(
                    init x = 1 + 1
                    init y = 2 - 1
                    init z = 3 + 8
                  )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(!program->Stmts.empty());
    EXPECT_EQ((int)program->Stmts.size(), 3);
    cout << program << endl;
}